

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedWithCleanupFallback
          (ThreadSafeArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  CleanupNode *pCVar1;
  ArenaBlock *pAVar2;
  SerialArena *this_00;
  char *pcVar3;
  char **ppcVar4;
  char **v2;
  LogMessage *pLVar5;
  ArenaBlock *pAVar6;
  bool bVar7;
  _func_void_void_ptr *destructor_local;
  size_t align_local;
  size_t n_local;
  ThreadSafeArena *this_local;
  LogMessage local_230;
  Voidify local_219;
  char *local_218;
  Nullable<const_char_*> local_210;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  char *next;
  char *local_1f8;
  char *ret;
  size_t local_1e8;
  ulong local_1e0;
  SerialArena *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  SerialArena *local_1b8;
  byte local_199;
  LogMessage local_198;
  Voidify local_181;
  Nullable<const_char_*> local_180;
  SerialArena *local_178;
  char *local_170 [2];
  char *end_1;
  byte local_149;
  LogMessage local_148;
  Voidify local_131;
  char *local_130;
  char *local_128;
  Nullable<const_char_*> local_120;
  long local_118;
  char *local_110;
  size_t local_100;
  SerialArena *local_f8;
  char *local_f0;
  char *local_e8;
  ChunkList *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  ChunkList *local_b8;
  byte local_99;
  LogMessage local_98;
  Voidify local_81;
  SerialArena *local_80;
  char *local_78;
  CleanupNode *local_70;
  char *end;
  byte local_51;
  LogMessage local_50;
  Voidify local_39;
  CleanupNode *local_38;
  CleanupNode *local_30;
  CleanupNode *local_28;
  long local_20;
  CleanupNode *local_18;
  CleanupNode *local_10;
  
  this_00 = GetSerialArenaFallback(this,n + 0x10);
  local_1e0 = n + 7 & 0xfffffffffffffff8;
  ret = (char *)destructor;
  local_1e8 = align;
  local_1d8 = this_00;
  local_100 = n;
  next = (char *)ArenaAlignAs(align);
  pcVar3 = SerialArena::ptr(this_00);
  local_1f8 = ArenaAlign::CeilDefaultAligned<char>((ArenaAlign *)&next,pcVar3);
  if (this_00->limit_ < local_1f8 + local_1e0) {
    local_1d0 = (char *)SerialArena::AllocateAlignedWithCleanupFallback
                                  (this_00,local_1e0,local_1e8,(_func_void_void_ptr *)ret);
  }
  else {
    UnpoisonMemoryRegion(local_1f8,local_1e0);
    absl_log_internal_check_op_result = local_1f8 + local_1e0;
    SerialArena::set_ptr(this_00,absl_log_internal_check_op_result);
    local_1c0 = local_1f8;
    local_1c8 = ret;
    local_e0 = &this_00->cleanup_list_;
    local_e8 = local_1f8;
    local_f0 = ret;
    local_1b8 = this_00;
    local_f8 = this_00;
    if ((this_00->cleanup_list_).next_ < (this_00->cleanup_list_).limit_) {
      local_c0 = local_1f8;
      local_c8 = ret;
      local_d8 = local_1f8;
      local_d0 = ret;
      pCVar1 = (this_00->cleanup_list_).next_;
      (this_00->cleanup_list_).next_ = pCVar1 + 1;
      pCVar1->elem = local_1f8;
      pCVar1->destructor = (_func_void_void_ptr *)ret;
      local_b8 = local_e0;
    }
    else {
      cleanup::ChunkList::AddFallback(local_e0,local_1f8,(_func_void_void_ptr *)ret,this_00);
    }
    local_99 = 0;
    bVar7 = true;
    if ((this_00->cleanup_list_).prefetch_ptr_ != (char *)0x0) {
      bVar7 = (this_00->cleanup_list_).head_ <= (Chunk *)(this_00->cleanup_list_).prefetch_ptr_;
    }
    local_80 = this_00;
    if (!bVar7) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                 ,0x136,
                 "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
                );
      local_99 = 1;
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar5);
    }
    if ((local_99 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_98);
    }
    local_28 = (this_00->cleanup_list_).next_;
    local_30 = (this_00->cleanup_list_).limit_;
    local_38 = (CleanupNode *)(this_00->cleanup_list_).prefetch_ptr_;
    local_20 = 0x180;
    if (((long)local_38 - (long)local_28 < 0x181) && (local_38 < local_30)) {
      ppcVar4 = std::max<char_const*>((char **)&local_28,(char **)&local_38);
      local_38 = (CleanupNode *)*ppcVar4;
      local_51 = 0;
      if (local_38 == (CleanupNode *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                   ,0x122,"prefetch_ptr != nullptr");
        local_51 = 1;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar5);
      }
      if ((local_51 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_50);
      }
      local_78 = (char *)((long)&local_38->elem + local_20);
      ppcVar4 = std::min<char_const*>((char **)&local_30,&local_78);
      local_70 = (CleanupNode *)*ppcVar4;
      for (; local_38 < local_70; local_38 = local_38 + 4) {
        local_10 = local_38;
      }
    }
    (this_00->cleanup_list_).prefetch_ptr_ = (char *)local_38;
    local_18 = local_38;
    ppcVar4 = absl::lts_20250127::log_internal::GetReferenceableValue<char*>(&this_00->limit_);
    local_218 = SerialArena::ptr(this_00);
    v2 = absl::lts_20250127::log_internal::GetReferenceableValue<char*>(&local_218);
    local_210 = absl::lts_20250127::log_internal::Check_GEImpl<char*,char*>
                          (ppcVar4,v2,"limit_ >= ptr()");
    if (local_210 != (Nullable<const_char_*>)0x0) {
      pcVar3 = absl::lts_20250127::implicit_cast<char_const*>(local_210);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_230,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                 ,0xf2,pcVar3);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_230);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_219,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_230);
    }
    local_180 = absl_log_internal_check_op_result;
    local_199 = 0;
    bVar7 = true;
    local_178 = this_00;
    if (this_00->prefetch_ptr_ != (char *)0x0) {
      pAVar2 = (ArenaBlock *)this_00->prefetch_ptr_;
      pAVar6 = SerialArena::head(this_00);
      bVar7 = pAVar6 <= pAVar2;
    }
    if (!bVar7) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                 ,0x12d,
                 "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
                );
      local_199 = 1;
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_198);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_181,pLVar5);
    }
    if ((local_199 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_198);
    }
    local_128 = this_00->limit_;
    local_130 = this_00->prefetch_ptr_;
    local_118 = 0x400;
    local_120 = local_180;
    local_110 = local_130;
    if ((long)local_130 - (long)local_180 < 0x401) {
      if (local_130 < local_128) {
        ppcVar4 = std::max<char_const*>(&local_120,&local_130);
        local_130 = *ppcVar4;
        local_149 = 0;
        if (local_130 == (char *)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_148,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/serial_arena.h"
                     ,0x122,"prefetch_ptr != nullptr");
          local_149 = 1;
          pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_148);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_131,pLVar5);
        }
        if ((local_149 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_148);
        }
        local_170[0] = local_130 + local_118;
        ppcVar4 = std::min<char_const*>(&local_128,local_170);
        for (; local_130 < *ppcVar4; local_130 = local_130 + 0x40) {
        }
      }
      local_110 = local_130;
    }
    this_00->prefetch_ptr_ = local_110;
    local_1d0 = local_1f8;
  }
  return local_1d0;
}

Assistant:

PROTOBUF_NOINLINE
void* ThreadSafeArena::AllocateAlignedWithCleanupFallback(
    size_t n, size_t align, void (*destructor)(void*)) {
  return GetSerialArenaFallback(n + kMaxCleanupNodeSize)
      ->AllocateAlignedWithCleanup(n, align, destructor);
}